

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_sha256_init_bip324(secp256k1_sha256 *hash)

{
  secp256k1_sha256_initialize(hash);
  hash->s[0] = 0x8c12d730;
  hash->s[1] = 0x827bd392;
  hash->s[2] = 0x9e4fb2ee;
  hash->s[3] = 0x207b373e;
  hash->s[4] = 0x2292bd7a;
  hash->s[5] = 0xaa5441bc;
  hash->s[6] = 0x15c3779f;
  hash->s[7] = 0xcfb52549;
  hash->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_ellswift_sha256_init_bip324(secp256k1_sha256* hash) {
    secp256k1_sha256_initialize(hash);
    hash->s[0] = 0x8c12d730ul;
    hash->s[1] = 0x827bd392ul;
    hash->s[2] = 0x9e4fb2eeul;
    hash->s[3] = 0x207b373eul;
    hash->s[4] = 0x2292bd7aul;
    hash->s[5] = 0xaa5441bcul;
    hash->s[6] = 0x15c3779ful;
    hash->s[7] = 0xcfb52549ul;

    hash->bytes = 64;
}